

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int tcp_dialer_alloc(tcp_dialer **dp)

{
  tcp_dialer *arg;
  tcp_dialer *d;
  int rv;
  tcp_dialer **dp_local;
  
  arg = (tcp_dialer *)nni_zalloc(0x5d0);
  if (arg == (tcp_dialer *)0x0) {
    dp_local._4_4_ = 2;
  }
  else {
    nni_mtx_init(&arg->mtx);
    nni_aio_list_init(&arg->conaios);
    nni_aio_init(&arg->resaio,tcp_dial_res_cb,arg);
    nni_aio_init(&arg->conaio,tcp_dial_con_cb,arg);
    dp_local._4_4_ = nni_tcp_dialer_init(&arg->d);
    if (dp_local._4_4_ == 0) {
      (arg->ops).sd_close = tcp_dialer_close;
      (arg->ops).sd_free = tcp_dialer_free;
      (arg->ops).sd_stop = tcp_dialer_stop;
      (arg->ops).sd_dial = tcp_dialer_dial;
      (arg->ops).sd_get = tcp_dialer_get;
      (arg->ops).sd_set = tcp_dialer_set;
      *dp = arg;
      dp_local._4_4_ = 0;
    }
    else {
      tcp_dialer_free(arg);
    }
  }
  return dp_local._4_4_;
}

Assistant:

static int
tcp_dialer_alloc(tcp_dialer **dp)
{
	int         rv;
	tcp_dialer *d;

	if ((d = NNI_ALLOC_STRUCT(d)) == NULL) {
		return (NNG_ENOMEM);
	}

	nni_mtx_init(&d->mtx);
	nni_aio_list_init(&d->conaios);
	nni_aio_init(&d->resaio, tcp_dial_res_cb, d);
	nni_aio_init(&d->conaio, tcp_dial_con_cb, d);

	if ((rv = nni_tcp_dialer_init(&d->d)) != 0) {
		tcp_dialer_free(d);
		return (rv);
	}

	d->ops.sd_close = tcp_dialer_close;
	d->ops.sd_free  = tcp_dialer_free;
	d->ops.sd_stop  = tcp_dialer_stop;
	d->ops.sd_dial  = tcp_dialer_dial;
	d->ops.sd_get   = tcp_dialer_get;
	d->ops.sd_set   = tcp_dialer_set;

	*dp = d;
	return (0);
}